

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmSat.c
# Opt level: O3

word Sfm_ComputeInterpolant(Sfm_Ntk_t *p)

{
  uint uVar1;
  uint uVar2;
  lit *plVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  word *pwVar6;
  int iVar7;
  int iVar8;
  Vec_Int_t *pVVar9;
  long lVar10;
  ulong uVar11;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  int pLits [2];
  uint local_38;
  uint local_34;
  
  iVar7 = sat_solver_nvars(p->pSat);
  sat_solver_setnvars(p->pSat,iVar7 + 1);
  iVar8 = p->iPivotNode;
  if ((-1 < (long)iVar8) && (iVar8 < (p->vId2Var).nSize)) {
    iVar8 = (p->vId2Var).pArray[iVar8];
    if (iVar8 < 1) {
      __assert_fail("Vec_IntEntry(&p->vId2Var, iObj) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmInt.h"
                    ,0xa7,"int Sfm_ObjSatVar(Sfm_Ntk_t *, int)");
    }
    local_38 = iVar8 * 2;
    if (iVar7 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    local_34 = iVar7 * 2;
    if (6 < p->vDivIds->nSize) {
      __assert_fail("Vec_IntSize(p->vDivIds) <= 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                    ,0xaa,"word Sfm_ComputeInterpolant(Sfm_Ntk_t *)");
    }
    uVar14 = 0;
LAB_0053b4b7:
    p->nSatCalls = p->nSatCalls + 1;
    iVar8 = sat_solver_solve(p->pSat,(lit *)&local_38,(lit *)&stack0xffffffffffffffd0,
                             (long)p->pPars->nBTLimit,0,0,0);
    if (iVar8 != 1) {
      if (iVar8 == -1) {
        return uVar14;
      }
      if (iVar8 == 0) {
        return 0x1234567812345678;
      }
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                    ,0xb4,"word Sfm_ComputeInterpolant(Sfm_Ntk_t *)");
    }
    p->vValues->nSize = 0;
    pVVar9 = p->vDivVars;
    if (0 < pVVar9->nSize) {
      lVar15 = 0;
      do {
        iVar8 = pVVar9->pArray[lVar15];
        if (((long)iVar8 < 0) || (p->pSat->size <= iVar8)) goto LAB_0053b883;
        Vec_IntPush(p->vValues,(uint)(p->pSat->model[iVar8] == 1));
        lVar15 = lVar15 + 1;
        pVVar9 = p->vDivVars;
      } while (lVar15 < pVVar9->nSize);
    }
    pVVar9 = p->vLits;
    pVVar9->nSize = 0;
    if ((int)local_38 < 0) {
LAB_0053b8e0:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
    Vec_IntPush(pVVar9,local_38 ^ 1);
    pVVar9 = p->vDivIds;
    if (0 < pVVar9->nSize) {
      lVar15 = 0;
      do {
        iVar8 = pVVar9->pArray[lVar15];
        if (((long)iVar8 < 0) || (p->pSat->size <= iVar8)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0xdf,"int sat_solver_var_literal(sat_solver *, int)");
        }
        Vec_IntPush(p->vLits,(uint)(p->pSat->model[iVar8] != 1) + iVar8 * 2);
        lVar15 = lVar15 + 1;
        pVVar9 = p->vDivIds;
      } while (lVar15 < pVVar9->nSize);
    }
    p->nSatCalls = p->nSatCalls + 1;
    plVar3 = p->vLits->pArray;
    iVar8 = sat_solver_solve(p->pSat,plVar3,plVar3 + p->vLits->nSize,(long)p->pPars->nBTLimit,0,0,0)
    ;
    if (iVar8 == -1) {
      pVVar9 = p->vLits;
      uVar1 = (p->pSat->conf_final).size;
      piVar4 = (p->pSat->conf_final).ptr;
      pVVar9->nSize = 0;
      if ((int)local_34 < 0) goto LAB_0053b8e0;
      Vec_IntPush(pVVar9,local_34 ^ 1);
      uVar13 = 0xffffffffffffffff;
      if (0 < (int)uVar1) {
        uVar11 = 0;
        do {
          uVar2 = piVar4[uVar11];
          if (uVar2 != local_38) {
            Vec_IntPush(p->vLits,uVar2);
            uVar2 = piVar4[uVar11];
            if ((int)uVar2 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            lVar15 = (long)p->vDivIds->nSize;
            if (lVar15 < 1) {
LAB_0053b864:
              __assert_fail("iVar >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                            ,0xd0,"word Sfm_ComputeInterpolant(Sfm_Ntk_t *)");
            }
            puVar12 = (uint *)p->vDivIds->pArray;
            lVar10 = 0;
            while (*puVar12 != uVar2 >> 1) {
              lVar10 = lVar10 + 8;
              puVar12 = puVar12 + 1;
              if (lVar15 * 8 == lVar10) goto LAB_0053b864;
            }
            uVar13 = uVar13 & ((ulong)(uVar2 & 1) - 1 ^ *(ulong *)((long)s_Truths6 + lVar10));
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != uVar1);
      }
      plVar3 = p->vLits->pArray;
      iVar8 = sat_solver_addclause(p->pSat,plVar3,plVar3 + p->vLits->nSize);
      uVar14 = uVar14 | uVar13;
      if (iVar8 == 0) {
        __assert_fail("status",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                      ,0xd5,"word Sfm_ComputeInterpolant(Sfm_Ntk_t *)");
      }
      goto LAB_0053b4b7;
    }
    if (iVar8 == 0) {
      return 0x1234567812345678;
    }
    if (iVar8 != 1) {
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                    ,0xc5,"word Sfm_ComputeInterpolant(Sfm_Ntk_t *)");
    }
    pVVar9 = p->vDivVars;
    iVar8 = pVVar9->nSize;
    if (iVar8 < 1) goto LAB_0053b842;
    piVar4 = pVVar9->pArray;
    pVVar5 = p->vValues;
    lVar15 = 0;
    while (lVar15 < pVVar5->nSize) {
      uVar1 = piVar4[lVar15];
      if (((int)uVar1 < 0) || (p->pSat->size <= (int)uVar1)) {
LAB_0053b883:
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
      if (pVVar5->pArray[lVar15] != (uint)(p->pSat->model[uVar1] == 1)) {
        if (p->vDivCexes->nSize <= lVar15) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        uVar1 = p->nCexes;
        pwVar6 = p->vDivCexes->pArray;
        uVar2 = *(uint *)((long)pwVar6 + lVar15 * 8 + (long)((int)uVar1 >> 5) * 4);
        if ((uVar2 >> (uVar1 & 0x1f) & 1) != 0) {
          __assert_fail("!Abc_InfoHasBit( (unsigned *)pSign, p->nCexes)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                        ,0xde,"word Sfm_ComputeInterpolant(Sfm_Ntk_t *)");
        }
        *(uint *)((long)pwVar6 + lVar15 * 8 + (long)((int)uVar1 >> 5) * 4) =
             1 << ((byte)uVar1 & 0x1f) ^ uVar2;
        iVar8 = pVVar9->nSize;
      }
      lVar15 = lVar15 + 1;
      if (iVar8 <= lVar15) {
LAB_0053b842:
        p->nCexes = p->nCexes + 1;
        return 0x8765432187654321;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

word Sfm_ComputeInterpolant( Sfm_Ntk_t * p )
{
    word * pSign, uCube, uTruth = 0;
    int status, i, Div, iVar, nFinal, * pFinal, nIter = 0;
    int pLits[2], nVars = sat_solver_nvars( p->pSat );
    sat_solver_setnvars( p->pSat, nVars + 1 );
    pLits[0] = Abc_Var2Lit( Sfm_ObjSatVar(p, p->iPivotNode), 0 ); // F = 1
    pLits[1] = Abc_Var2Lit( nVars, 0 ); // iNewLit
    assert( Vec_IntSize(p->vDivIds) <= 6 );
    while ( 1 ) 
    {
        // find onset minterm
        p->nSatCalls++;
        status = sat_solver_solve( p->pSat, pLits, pLits + 2, p->pPars->nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return SFM_SAT_UNDEC;
        if ( status == l_False )
            return uTruth;
        assert( status == l_True );
        // remember variable values
        Vec_IntClear( p->vValues );
        Vec_IntForEachEntry( p->vDivVars, iVar, i )
            Vec_IntPush( p->vValues, sat_solver_var_value(p->pSat, iVar) );
        // collect divisor literals
        Vec_IntClear( p->vLits );
        Vec_IntPush( p->vLits, Abc_LitNot(pLits[0]) ); // F = 0
        Vec_IntForEachEntry( p->vDivIds, Div, i )
            Vec_IntPush( p->vLits, sat_solver_var_literal(p->pSat, Div) );
        // check against offset
        p->nSatCalls++;
        status = sat_solver_solve( p->pSat, Vec_IntArray(p->vLits), Vec_IntArray(p->vLits) + Vec_IntSize(p->vLits), p->pPars->nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return SFM_SAT_UNDEC;
        if ( status == l_True )
            break;
        assert( status == l_False );
        // compute cube and add clause
        nFinal = sat_solver_final( p->pSat, &pFinal );
        uCube = ~(word)0;
        Vec_IntClear( p->vLits );
        Vec_IntPush( p->vLits, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
        for ( i = 0; i < nFinal; i++ )
        {
            if ( pFinal[i] == pLits[0] )
                continue;
            Vec_IntPush( p->vLits, pFinal[i] );
            iVar = Vec_IntFind( p->vDivIds, Abc_Lit2Var(pFinal[i]) );   assert( iVar >= 0 );
            uCube &= Abc_LitIsCompl(pFinal[i]) ? s_Truths6[iVar] : ~s_Truths6[iVar];
        }
        uTruth |= uCube;
        status = sat_solver_addclause( p->pSat, Vec_IntArray(p->vLits), Vec_IntArray(p->vLits) + Vec_IntSize(p->vLits) );
        assert( status );
        nIter++;
    }
    assert( status == l_True );
    // store the counter-example
    Vec_IntForEachEntry( p->vDivVars, iVar, i )
        if ( Vec_IntEntry(p->vValues, i) ^ sat_solver_var_value(p->pSat, iVar) ) // insert 1
        {
            pSign = Vec_WrdEntryP( p->vDivCexes, i );
            assert( !Abc_InfoHasBit( (unsigned *)pSign, p->nCexes) );
            Abc_InfoXorBit( (unsigned *)pSign, p->nCexes );
        }
    p->nCexes++;
    return SFM_SAT_SAT;
}